

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool op_smlaxxx(DisasContext_conflict1 *s,arg_rrrr *a,int add_long,_Bool nt,_Bool mt)

{
  TCGContext_conflict1 *tcg_ctx_00;
  int iVar1;
  TCGv_i32 t0_00;
  TCGv_i32 pTVar2;
  TCGv_i32 rh;
  TCGv_i32 ret;
  TCGv_i32 th;
  TCGv_i32 tl;
  TCGv_i32 t1;
  TCGv_i32 t0;
  TCGContext_conflict1 *tcg_ctx;
  _Bool mt_local;
  _Bool nt_local;
  int add_long_local;
  arg_rrrr *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (s->thumb == 0) {
    iVar1 = arm_dc_feature(s,0xf);
  }
  else {
    iVar1 = arm_dc_feature(s,0x22);
  }
  if (iVar1 == 0) {
    s_local._7_1_ = false;
  }
  else {
    t0_00 = load_reg(s,a->rn);
    pTVar2 = load_reg(s,a->rm);
    gen_mulxy(tcg_ctx_00,t0_00,pTVar2,nt & 1,mt & 1);
    tcg_temp_free_i32(tcg_ctx_00,pTVar2);
    if (add_long == 0) {
      store_reg(s,a->rd,t0_00);
    }
    else if (add_long == 1) {
      pTVar2 = load_reg(s,a->ra);
      gen_helper_add_setq(tcg_ctx_00,t0_00,tcg_ctx_00->cpu_env,t0_00,pTVar2);
      tcg_temp_free_i32(tcg_ctx_00,pTVar2);
      store_reg(s,a->rd,t0_00);
    }
    else {
      if (add_long != 2) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate.c"
                   ,0x20dd,(char *)0x0);
      }
      pTVar2 = load_reg(s,a->ra);
      rh = load_reg(s,a->rd);
      ret = tcg_temp_new_i32(tcg_ctx_00);
      tcg_gen_sari_i32_aarch64(tcg_ctx_00,ret,t0_00,0x1f);
      tcg_gen_add2_i32_aarch64(tcg_ctx_00,pTVar2,rh,pTVar2,rh,t0_00,ret);
      tcg_temp_free_i32(tcg_ctx_00,t0_00);
      tcg_temp_free_i32(tcg_ctx_00,ret);
      store_reg(s,a->ra,pTVar2);
      store_reg(s,a->rd,rh);
    }
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool op_smlaxxx(DisasContext *s, arg_rrrr *a,
                       int add_long, bool nt, bool mt)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t0, t1, tl, th;

    if (s->thumb
        ? !arm_dc_feature(s, ARM_FEATURE_THUMB_DSP)
        : !ENABLE_ARCH_5TE) {
        return false;
    }

    t0 = load_reg(s, a->rn);
    t1 = load_reg(s, a->rm);
    gen_mulxy(tcg_ctx, t0, t1, nt, mt);
    tcg_temp_free_i32(tcg_ctx, t1);

    switch (add_long) {
    case 0:
        store_reg(s, a->rd, t0);
        break;
    case 1:
        t1 = load_reg(s, a->ra);
        gen_helper_add_setq(tcg_ctx, t0, tcg_ctx->cpu_env, t0, t1);
        tcg_temp_free_i32(tcg_ctx, t1);
        store_reg(s, a->rd, t0);
        break;
    case 2:
        tl = load_reg(s, a->ra);
        th = load_reg(s, a->rd);
        /* Sign-extend the 32-bit product to 64 bits.  */
        t1 = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_sari_i32(tcg_ctx, t1, t0, 31);
        tcg_gen_add2_i32(tcg_ctx, tl, th, tl, th, t0, t1);
        tcg_temp_free_i32(tcg_ctx, t0);
        tcg_temp_free_i32(tcg_ctx, t1);
        store_reg(s, a->ra, tl);
        store_reg(s, a->rd, th);
        break;
    default:
        g_assert_not_reached();
        break;
    }
    return true;
}